

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O2

uint64_t loader::exe_reader::get_file_version(istream *is)

{
  char cVar1;
  char cVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  BinaryType BVar5;
  uint uVar6;
  resource rVar7;
  uint64_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  
  BVar5 = anon_unknown_0::determine_binary_type(is);
  uVar8 = 0xffffffffffffffff;
  if (BVar5 == VXDMagic) {
    std::istream::seekg((long)is,0xb6);
    uVar9 = util::load<int,util::little_endian>(is);
    uVar6 = util::load<int,util::little_endian>(is);
    if (uVar6 < 0xd) {
      return 0xffffffffffffffff;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      return 0xffffffffffffffff;
    }
    std::istream::seekg(is,uVar9,0);
    cVar1 = util::load<unsigned_char,util::little_endian>(is);
    uVar3 = util::load<short,util::little_endian>(is);
    cVar2 = util::load<unsigned_char,util::little_endian>(is);
    std::istream::seekg((long)is,4);
    uVar9 = util::load<int,util::little_endian>(is);
    if (uVar9 < 0x49) {
      return 0xffffffffffffffff;
    }
    if (cVar2 != -1) {
      return 0xffffffffffffffff;
    }
    if (uVar3 != 0x10) {
      return 0xffffffffffffffff;
    }
    if (cVar1 != -1) {
      return 0xffffffffffffffff;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      return 0xffffffffffffffff;
    }
    uVar3 = util::load<short,util::little_endian>(is);
    uVar4 = util::load<short,util::little_endian>(is);
    std::istream::seekg((long)is,0x10);
    if (uVar4 < 0x34) {
      return 0xffffffffffffffff;
    }
    if (uVar3 < 0x48) {
      return 0xffffffffffffffff;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      return 0xffffffffffffffff;
    }
  }
  else {
    if (BVar5 == PEMagic) {
      rVar7 = anon_unknown_0::pe_reader::find_resource(is,1,0x10,0xffffffff);
      uVar10 = rVar7.offset;
      if (uVar10 == 0) {
        return 0xffffffffffffffff;
      }
      std::istream::seekg(is,uVar10 + 6,0);
      uVar9 = 9;
      do {
        uVar3 = util::load<short,util::little_endian>(is);
        if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
          return 0xffffffffffffffff;
        }
        uVar9 = uVar9 + 2;
      } while (uVar3 != 0);
    }
    else {
      if (BVar5 != OS2Magic) {
        return 0xffffffffffffffff;
      }
      rVar7 = anon_unknown_0::ne_reader::find_resource(is,1,0x10);
      if (rVar7.offset == 0) {
        return 0xffffffffffffffff;
      }
      uVar10 = rVar7.offset + 4;
      std::istream::seekg(is,uVar10,0);
      uVar9 = 3;
      do {
        cVar1 = util::load<unsigned_char,util::little_endian>(is);
        if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
          return 0xffffffffffffffff;
        }
        uVar9 = uVar9 + 1;
      } while (cVar1 != '\0');
    }
    std::istream::seekg(is,(uVar9 & 0xfffffffc) + uVar10,0);
  }
  uVar9 = util::load<int,util::little_endian>(is);
  if ((uVar9 == 0xfeef04bd) &&
     ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) == 0)) {
    std::istream::seekg((long)is,4);
    uVar9 = util::load<int,util::little_endian>(is);
    uVar6 = util::load<int,util::little_endian>(is);
    uVar8 = -(ulong)(((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) |
            CONCAT44(uVar9,uVar6);
  }
  return uVar8;
}

Assistant:

boost::uint64_t exe_reader::get_file_version(std::istream & is) {
	
	bool found = false;
	BinaryType bintype = determine_binary_type(is);
	switch(bintype) {
		case OS2Magic: found = ne_reader::get_file_version(is); break;
		case VXDMagic: found = le_reader::get_file_version(is); break;
		case PEMagic:  found = pe_reader::get_file_version(is); break;
		default: break;
	}
	if(!found) {
		return FileVersionUnknown;
	}
	
	boost::uint32_t magic = util::load<boost::uint32_t>(is);
	if(is.fail() || magic != 0xfeef04bd) {
		return FileVersionUnknown;
	}
	
	is.seekg(4, std::ios_base::cur); // skip struct version
	boost::uint32_t file_version_ms = util::load<boost::uint32_t>(is);
	boost::uint32_t file_version_ls = util::load<boost::uint32_t>(is);
	if(is.fail()) {
		return FileVersionUnknown;
	}
	
	return (boost::uint64_t(file_version_ms) << 32) | boost::uint64_t(file_version_ls);
}